

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineClearUtil.cpp
# Opt level: O1

IVec4 __thiscall vkt::pipeline::defaultClearColorInt(pipeline *this,TextureFormat *format)

{
  int i;
  long lVar1;
  undefined8 extraout_RDX;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  IVec4 IVar6;
  Vec4 color;
  Vector<float,_4> res;
  TextureFormatInfo formatInfo;
  float local_98 [10];
  float local_70 [4];
  TextureFormatInfo local_60;
  
  tcu::getTextureFormatInfo(&local_60,format);
  local_70[0] = 0.39;
  local_70[1] = 0.58;
  local_70[2] = 0.93;
  local_70[3] = 1.0;
  local_98[4] = 0.0;
  local_98[5] = 0.0;
  local_98[6] = 0.0;
  local_98[7] = 0.0;
  lVar1 = 0;
  do {
    local_98[lVar1 + 4] = local_70[lVar1] - local_60.lookupBias.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  local_98[2] = 0.0;
  local_98[3] = 0.0;
  lVar1 = 0;
  do {
    local_98[lVar1] = local_98[lVar1 + 4] / local_60.lookupScale.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  fVar2 = floorf(local_98[0] + 0.5);
  fVar3 = floorf(local_98[1] + 0.5);
  fVar4 = floorf(local_98[2] + 0.5);
  fVar5 = floorf(local_98[3] + 0.5);
  *(int *)this = (int)fVar2;
  *(int *)(this + 4) = (int)fVar3;
  *(int *)(this + 8) = (int)fVar4;
  *(int *)(this + 0xc) = (int)fVar5;
  IVar6.m_data[2] = (int)extraout_RDX;
  IVar6.m_data[3] = (int)((ulong)extraout_RDX >> 0x20);
  IVar6.m_data._0_8_ = this;
  return (IVec4)IVar6.m_data;
}

Assistant:

tcu::IVec4 defaultClearColorInt (const tcu::TextureFormat& format)
{
	const tcu::TextureFormatInfo	formatInfo	= tcu::getTextureFormatInfo(format);
	const tcu::Vec4					color		= (defaultClearColorUnorm() - formatInfo.lookupBias) / formatInfo.lookupScale;

	const tcu::IVec4				result		((deInt32)deFloatRound(color.x()), (deInt32)deFloatRound(color.y()),
												 (deInt32)deFloatRound(color.z()), (deInt32)deFloatRound(color.w()));

	return result;
}